

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

void rf_gfx_enable_texture(uint id)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  rf_draw_call *prVar4;
  long lVar5;
  rf_vertex_buffer *prVar6;
  long lVar7;
  rf_render_batch *prVar8;
  uint uVar9;
  int iVar10;
  
  prVar8 = (rf__ctx->field_0).current_batch;
  lVar7 = prVar8->draw_calls_counter;
  prVar4 = prVar8->draw_calls;
  if (prVar4[lVar7 + -1].texture_id != id) {
    uVar3 = prVar4[lVar7 + -1].vertex_count;
    if (0 < (int)uVar3) {
      if (prVar4[lVar7 + -1].mode == RF_TRIANGLES) {
        uVar9 = 1;
        if (3 < uVar3) {
          uVar9 = 4 - (uVar3 & 3);
        }
      }
      else {
        uVar9 = 0;
        if (prVar4[lVar7 + -1].mode == RF_LINES) {
          uVar9 = uVar3 & 3;
        }
      }
      prVar4[lVar7 + -1].vertex_alignment = uVar9;
      lVar5 = prVar8->current_buffer;
      prVar6 = prVar8->vertex_buffers;
      iVar10 = prVar6[lVar5].v_counter + uVar9;
      if (iVar10 < prVar6[lVar5].elements_count * 4) {
        prVar6[lVar5].v_counter = iVar10;
        uVar1 = prVar6[lVar5].tc_counter;
        uVar2 = prVar6[lVar5].c_counter;
        prVar6[lVar5].tc_counter = uVar9 + uVar1;
        prVar6[lVar5].c_counter = uVar9 + uVar2;
        lVar7 = lVar7 + 1;
        prVar8->draw_calls_counter = lVar7;
      }
      else {
        rf_gfx_draw();
        prVar8 = (rf__ctx->field_0).current_batch;
        lVar7 = prVar8->draw_calls_counter;
      }
    }
    if (0xff < lVar7) {
      rf_gfx_draw();
      prVar8 = (rf__ctx->field_0).current_batch;
      lVar7 = prVar8->draw_calls_counter;
    }
    prVar4 = prVar8->draw_calls;
    prVar4[lVar7 + -1].texture_id = id;
    prVar4[lVar7 + -1].vertex_count = 0;
  }
  return;
}

Assistant:

RF_API void rf_gfx_enable_texture(unsigned int id)
{
    if (rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].texture_id != id)
    {
        if (rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_count > 0)
        {
            // Make sure current rf_ctx->gl_ctx.draws[i].vertex_count is aligned a multiple of 4,
            // that way, following QUADS drawing will keep aligned with index processing
            // It implies adding some extra alignment vertex at the end of the draw,
            // those vertex are not processed but they are considered as an additional offset
            // for the next set of vertex to be drawn
            if (rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].mode == RF_LINES)
            {
                rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_alignment = ((rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_count < 4) ? rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_count : rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_count % 4);
            }
            else if (rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].mode == RF_TRIANGLES)
            {
                rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_alignment = ((rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_count < 4) ? 1 : (4 - (rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_count % 4)));
            }
            else
            {
                rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_alignment = 0;
            }

            if (rf_gfx_check_buffer_limit(rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_alignment))
            {
                rf_gfx_draw();
            }
            else
            {
                rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter += rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_alignment;
                rf_batch.vertex_buffers[rf_batch.current_buffer].c_counter += rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_alignment;
                rf_batch.vertex_buffers[rf_batch.current_buffer].tc_counter += rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_alignment;

                rf_batch.draw_calls_counter++;
            }
        }

        if (rf_batch.draw_calls_counter >= RF_DEFAULT_BATCH_DRAW_CALLS_COUNT)
        {
            rf_gfx_draw();
        }

        rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].texture_id = id;
        rf_batch.draw_calls[rf_batch.draw_calls_counter - 1].vertex_count = 0;
    }
}